

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
glcts::(anonymous_namespace)::LoadStoreMachine::Write<tcu::Vector<float,4>>
          (LoadStoreMachine *this,GLenum internalformat,Vector<float,_4> *write_value,
          Vector<float,_4> *expected_value)

{
  uint uVar1;
  byte bVar2;
  bool bVar3;
  char *pcVar4;
  reference data;
  ivec4 *a;
  undefined8 uVar5;
  CallLogWrapper *this_00;
  Vector<int,_4> local_170;
  string local_160;
  Vector<int,_4> local_13c;
  uint local_12c;
  void *pvStack_128;
  int i_1;
  ivec4 *out_data;
  undefined1 local_118 [6];
  bool status;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> b_data;
  GLuint local_f8;
  int i;
  GLuint textures [4];
  string local_e0;
  string local_c0;
  string local_a0;
  string local_70;
  char *local_50;
  char *src_fs;
  GLuint program_load;
  GLuint program_store;
  int kSize;
  int kTargets;
  GLenum targets [4];
  Vector<float,_4> *expected_value_local;
  Vector<float,_4> *write_value_local;
  GLenum internalformat_local;
  LoadStoreMachine *this_local;
  
  _kSize = 0x806f00000de1;
  targets[0] = 0x8513;
  targets[1] = 0x8c1a;
  program_store = 4;
  program_load = 100;
  src_fs._4_4_ = 0;
  src_fs._0_4_ = 0;
  targets._8_8_ = expected_value;
  if (*(int *)(this + 0x30) == 0) {
    local_50 = "\nvoid main() {\n  discard;\n}";
    GenStoreShader<tcu::Vector<float,4>>
              (&local_70,this,*(int *)(this + 0x30),internalformat,write_value);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    src_fs._4_4_ = glcts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                             ((ShaderImageLoadStoreBase *)this,pcVar4,local_50,false,false);
    std::__cxx11::string::~string((string *)&local_70);
    GenLoadShader<tcu::Vector<float,4>>
              (&local_a0,this,*(int *)(this + 0x30),internalformat,(Vector<float,_4> *)targets._8_8_
              );
    pcVar4 = (char *)std::__cxx11::string::c_str();
    src_fs._0_4_ = glcts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                             ((ShaderImageLoadStoreBase *)this,pcVar4,local_50,false,false);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  else if (*(int *)(this + 0x30) == 4) {
    GenStoreShader<tcu::Vector<float,4>>
              (&local_c0,this,*(int *)(this + 0x30),internalformat,write_value);
    src_fs._4_4_ = glcts::anon_unknown_0::ShaderImageLoadStoreBase::CreateComputeProgram
                             ((ShaderImageLoadStoreBase *)this,&local_c0,false);
    std::__cxx11::string::~string((string *)&local_c0);
    GenLoadShader<tcu::Vector<float,4>>
              (&local_e0,this,*(int *)(this + 0x30),internalformat,(Vector<float,_4> *)targets._8_8_
              );
    src_fs._0_4_ = glcts::anon_unknown_0::ShaderImageLoadStoreBase::CreateComputeProgram
                             ((ShaderImageLoadStoreBase *)this,&local_e0,false);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  glu::CallLogWrapper::glGenTextures((CallLogWrapper *)(this + 8),4,&local_f8);
  for (b_data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      b_data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < 4;
      b_data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           b_data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    glu::CallLogWrapper::glBindTexture
              ((CallLogWrapper *)(this + 8),
               (&kSize)[b_data.
                        super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_],
               (&local_f8)
               [b_data.
                super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_]);
    glu::CallLogWrapper::glTexParameteri
              ((CallLogWrapper *)(this + 8),
               (&kSize)[b_data.
                        super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_],0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri
              ((CallLogWrapper *)(this + 8),
               (&kSize)[b_data.
                        super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_],0x2800,0x2600);
    if ((&kSize)[b_data.
                 super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_] == 0xde1) {
      glu::CallLogWrapper::glTexStorage2D
                ((CallLogWrapper *)(this + 8),
                 (&kSize)[b_data.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_],1,internalformat
                 ,100,1);
    }
    else if (((&kSize)[b_data.
                       super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_] == 0x806f) ||
            ((&kSize)[b_data.
                      super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_] == 0x8c1a)) {
      glu::CallLogWrapper::glTexStorage3D
                ((CallLogWrapper *)(this + 8),
                 (&kSize)[b_data.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_],1,internalformat
                 ,100,1,2);
    }
    else if ((&kSize)[b_data.
                      super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_] == 0x8513) {
      glu::CallLogWrapper::glTexStorage2D
                ((CallLogWrapper *)(this + 8),
                 (&kSize)[b_data.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_],1,internalformat
                 ,100,100);
    }
  }
  this_00 = (CallLogWrapper *)(this + 8);
  glu::CallLogWrapper::glBindImageTexture(this_00,1,local_f8,0,'\0',0,0x88b9,internalformat);
  glu::CallLogWrapper::glBindImageTexture(this_00,2,i,0,'\x01',0,0x88b9,internalformat);
  glu::CallLogWrapper::glBindImageTexture(this_00,0,textures[0],0,'\x01',0,0x88b9,internalformat);
  glu::CallLogWrapper::glBindImageTexture(this_00,3,textures[1],0,'\x01',0,0x88b9,internalformat);
  std::allocator<tcu::Vector<int,_4>_>::allocator
            ((allocator<tcu::Vector<int,_4>_> *)((long)&out_data + 7));
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_118,100,
             (allocator<tcu::Vector<int,_4>_> *)((long)&out_data + 7));
  std::allocator<tcu::Vector<int,_4>_>::~allocator
            ((allocator<tcu::Vector<int,_4>_> *)((long)&out_data + 7));
  glu::CallLogWrapper::glBindBufferBase
            ((CallLogWrapper *)(this + 8),0x90d2,0,*(GLuint *)(this + 0x2c));
  data = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                   ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_118,
                    0);
  glu::CallLogWrapper::glBufferData((CallLogWrapper *)(this + 8),0x90d2,0x640,data,0x88e4);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),src_fs._4_4_);
  glu::CallLogWrapper::glBindVertexArray((CallLogWrapper *)(this + 8),*(GLuint *)(this + 0x28));
  if (*(int *)(this + 0x30) == 4) {
    glu::CallLogWrapper::glDispatchCompute((CallLogWrapper *)(this + 8),1,1,1);
  }
  else if (*(int *)(this + 0x30) == 0) {
    glu::CallLogWrapper::glDrawArrays((CallLogWrapper *)(this + 8),0,0,100);
  }
  out_data._6_1_ = 1;
  glu::CallLogWrapper::glMemoryBarrier((CallLogWrapper *)(this + 8),0x100);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),3,local_f8,0,'\0',0,35000,internalformat);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),2,i,0,'\x01',0,35000,internalformat);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),1,textures[0],0,'\x01',0,35000,internalformat);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),0,textures[1],0,'\x01',0,35000,internalformat);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),(GLuint)src_fs);
  if (*(int *)(this + 0x30) == 0) {
    glu::CallLogWrapper::glDrawArrays((CallLogWrapper *)(this + 8),0,0,100);
  }
  else if (*(int *)(this + 0x30) == 4) {
    glu::CallLogWrapper::glDispatchCompute((CallLogWrapper *)(this + 8),1,1,1);
  }
  glu::CallLogWrapper::glMemoryBarrier((CallLogWrapper *)(this + 8),0x200);
  pvStack_128 = glu::CallLogWrapper::glMapBufferRange((CallLogWrapper *)(this + 8),0x90d2,0,0x640,1)
  ;
  for (local_12c = 0; (int)local_12c < 100; local_12c = local_12c + 1) {
    a = (ivec4 *)((long)pvStack_128 + (long)(int)local_12c * 0x10);
    tcu::Vector<int,_4>::Vector(&local_13c,0,1,0,1);
    bVar3 = glcts::anon_unknown_0::ShaderImageLoadStoreBase::Equal
                      ((ShaderImageLoadStoreBase *)this,a,&local_13c,0);
    uVar1 = local_12c;
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      out_data._6_1_ = 0;
      tcu::Vector<int,_4>::Vector
                (&local_170,(Vector<int,_4> *)((long)pvStack_128 + (long)(int)local_12c * 0x10));
      ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>
                (&local_160,(ShaderImageLoadStoreBase *)this,&local_170);
      uVar5 = std::__cxx11::string::c_str();
      glcts::anon_unknown_0::Output
                ("[%d] load/store operation check failed. (%s) \n",(ulong)uVar1,uVar5);
      std::__cxx11::string::~string((string *)&local_160);
    }
  }
  glu::CallLogWrapper::glUnmapBuffer((CallLogWrapper *)(this + 8),0x90d2);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),0);
  glu::CallLogWrapper::glDeleteProgram((CallLogWrapper *)(this + 8),src_fs._4_4_);
  glu::CallLogWrapper::glDeleteProgram((CallLogWrapper *)(this + 8),(GLuint)src_fs);
  glu::CallLogWrapper::glDeleteTextures((CallLogWrapper *)(this + 8),4,&local_f8);
  bVar2 = out_data._6_1_;
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_118);
  return (bool)(bVar2 & 1);
}

Assistant:

bool Write(GLenum internalformat, const T& write_value, const T& expected_value)
	{
		const GLenum targets[]	 = { GL_TEXTURE_2D, GL_TEXTURE_3D, GL_TEXTURE_CUBE_MAP, GL_TEXTURE_2D_ARRAY };
		const int	kTargets	  = sizeof(targets) / sizeof(targets[0]);
		const int	kSize		   = 100;
		GLuint		 program_store = 0;
		GLuint		 program_load  = 0;
		if (m_stage == 0)
		{ // VS
			const char* src_fs = NL "void main() {" NL "  discard;" NL "}";
			program_store	  = BuildProgram(GenStoreShader(m_stage, internalformat, write_value).c_str(), src_fs);
			program_load	   = BuildProgram(GenLoadShader(m_stage, internalformat, expected_value).c_str(), src_fs);
		}
		else if (m_stage == 4)
		{ // CS
			program_store = CreateComputeProgram(GenStoreShader(m_stage, internalformat, write_value));
			program_load  = CreateComputeProgram(GenLoadShader(m_stage, internalformat, expected_value));
		}
		GLuint textures[kTargets];
		glGenTextures(kTargets, textures);

		for (int i = 0; i < kTargets; ++i)
		{
			glBindTexture(targets[i], textures[i]);
			glTexParameteri(targets[i], GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(targets[i], GL_TEXTURE_MAG_FILTER, GL_NEAREST);

			if (targets[i] == GL_TEXTURE_2D)
			{
				glTexStorage2D(targets[i], 1, internalformat, kSize, 1);
			}
			else if (targets[i] == GL_TEXTURE_3D || targets[i] == GL_TEXTURE_2D_ARRAY)
			{
				glTexStorage3D(targets[i], 1, internalformat, kSize, 1, 2);
			}
			else if (targets[i] == GL_TEXTURE_CUBE_MAP)
			{
				glTexStorage2D(targets[i], 1, internalformat, kSize, kSize);
			}
		}
		glBindImageTexture(1, textures[0], 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat); // 2D
		glBindImageTexture(2, textures[1], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);  // 3D
		glBindImageTexture(0, textures[2], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);  // Cube
		glBindImageTexture(3, textures[3], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);  // 2DArray

		std::vector<ivec4> b_data(kSize);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, kSize * 4 * 4, &b_data[0], GL_STATIC_DRAW);

		glUseProgram(program_store);
		glBindVertexArray(m_vao);
		if (m_stage == 4)
		{ // CS
			glDispatchCompute(1, 1, 1);
		}
		else if (m_stage == 0)
		{ // VS
			glDrawArrays(GL_POINTS, 0, kSize);
		}
		bool status = true;
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);

		glBindImageTexture(3, textures[0], 0, GL_FALSE, 0, GL_READ_ONLY, internalformat); // 2D
		glBindImageTexture(2, textures[1], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);  // 3D
		glBindImageTexture(1, textures[2], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);  // Cube
		glBindImageTexture(0, textures[3], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);  // 2DArray

		glUseProgram(program_load);
		if (m_stage == 0)
		{ // VS
			glDrawArrays(GL_POINTS, 0, kSize);
		}
		else if (m_stage == 4)
		{ // CS
			glDispatchCompute(1, 1, 1);
		}
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		ivec4* out_data = (ivec4*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, kSize * 4 * 4, GL_MAP_READ_BIT);
		for (int i = 0; i < kSize; ++i)
		{
			if (!Equal(out_data[i], ivec4(0, 1, 0, 1), 0))
			{
				status = false;
				Output("[%d] load/store operation check failed. (%s) \n", i, ToString(out_data[i]).c_str());
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glUseProgram(0);
		glDeleteProgram(program_store);
		glDeleteProgram(program_load);
		glDeleteTextures(kTargets, textures);
		return status;
	}